

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O3

ion_dictionary_type_t ion_get_dictionary_type(ion_dictionary_id_t id)

{
  ion_err_t iVar1;
  ion_dictionary_type_t iVar2;
  ion_dictionary_config_info_t config;
  ion_dictionary_config_info_t local_20;
  
  local_20.id = id;
  iVar1 = ion_master_table_read(&local_20,-1);
  iVar2 = dictionary_type_error_t;
  if (iVar1 == '\0') {
    iVar2 = local_20.dictionary_type;
  }
  return iVar2;
}

Assistant:

ion_dictionary_type_t
ion_get_dictionary_type(
	ion_dictionary_id_t id
) {
	ion_err_t						err;
	ion_dictionary_config_info_t	config;

	err = ion_lookup_in_master_table(id, &config);

	if (err_ok != err) {
		return dictionary_type_error_t;
	}

	return config.dictionary_type;
}